

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

int compare(void *arg1,void *arg2)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  void *arg2_local;
  void *arg1_local;
  
  uVar1 = PalEntry::operator_cast_to_unsigned_int(GPalette.BaseColors + *arg1);
  uVar2 = PalEntry::operator_cast_to_unsigned_int(GPalette.BaseColors + *arg1);
  uVar3 = PalEntry::operator_cast_to_unsigned_int(GPalette.BaseColors + *arg1);
  uVar4 = PalEntry::operator_cast_to_unsigned_int(GPalette.BaseColors + *arg2);
  uVar5 = PalEntry::operator_cast_to_unsigned_int(GPalette.BaseColors + *arg2);
  uVar6 = PalEntry::operator_cast_to_unsigned_int(GPalette.BaseColors + *arg2);
  if ((uVar1 >> 0x10 & 0xff) * 299 + (uVar2 >> 8 & 0xff) * 0x24b + (uVar3 & 0xff) * 0x72 <
      (uVar4 >> 0x10 & 0xff) * 299 + (uVar5 >> 8 & 0xff) * 0x24b + (uVar6 & 0xff) * 0x72) {
    arg1_local._4_4_ = -1;
  }
  else {
    arg1_local._4_4_ = 1;
  }
  return arg1_local._4_4_;
}

Assistant:

static int compare (const void *arg1, const void *arg2)
{
	if (RPART(GPalette.BaseColors[*((BYTE *)arg1)]) * 299 +
		GPART(GPalette.BaseColors[*((BYTE *)arg1)]) * 587 +
		BPART(GPalette.BaseColors[*((BYTE *)arg1)]) * 114  <
		RPART(GPalette.BaseColors[*((BYTE *)arg2)]) * 299 +
		GPART(GPalette.BaseColors[*((BYTE *)arg2)]) * 587 +
		BPART(GPalette.BaseColors[*((BYTE *)arg2)]) * 114)
		return -1;
	else
		return 1;
}